

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

QPointF __thiscall QGraphicsViewPrivate::mapToScene(QGraphicsViewPrivate *this,QPointF *point)

{
  double dVar1;
  long in_FS_OFFSET;
  double dVar2;
  QPointF QVar3;
  QPointF local_68 [5];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  dVar1 = point->xp;
  dVar2 = point->yp;
  if ((this->field_0x300 & 0x20) != 0) {
    updateScroll(this);
  }
  dVar1 = (double)this->scrollX + dVar1;
  if ((this->field_0x300 & 0x20) != 0) {
    updateScroll(this);
  }
  dVar2 = (double)this->scrollY + dVar2;
  if ((this->field_0x300 & 0x10) == 0) {
    QTransform::inverted((bool *)local_68);
    dVar1 = (double)QTransform::map(local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  QVar3.yp = dVar2;
  QVar3.xp = dVar1;
  return QVar3;
}

Assistant:

QPointF QGraphicsViewPrivate::mapToScene(const QPointF &point) const
{
    QPointF p = point;
    p.rx() += horizontalScroll();
    p.ry() += verticalScroll();
    return identityMatrix ? p : matrix.inverted().map(p);
}